

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extralev.c
# Opt level: O2

void roguecorr(level *lev,int x,int y,int dir)

{
  undefined1 *puVar1;
  uchar *puVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  char *s;
  uint uVar12;
  uint uVar13;
  int iVar14;
  
  if (dir == 8) {
    puVar2 = &r[x][y].doortable;
    *puVar2 = *puVar2 & 0xf7;
    iVar14 = (int)r[x][y].rlx;
    if (r[x][y].real == '\0') {
      iVar14 = iVar14 + x * 0x1a + 1;
      uVar12 = y * 7 + (int)r[x][y].rly;
    }
    else {
      cVar3 = r[x][y].dx;
      cVar4 = r[x][y].rly;
      iVar5 = rn2((int)r[x][y].dy);
      iVar14 = (int)cVar3 + iVar14 + x * 0x1a;
      uVar13 = iVar14 + 1;
      uVar12 = y * 7 + (int)cVar4 + iVar5;
      cVar3 = lev->locations[(int)uVar13][(int)uVar12].typ;
      if (cVar3 == '\0' || '\f' < cVar3) {
        impossible("down: no wall at %d,%d?",(ulong)uVar13,(ulong)uVar12);
      }
      dodoor(lev,uVar13,uVar12,lev->rooms + r[x][y].nroom);
      puVar1 = &lev->locations[(int)uVar13][(int)uVar12].field_0x6;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe0f;
      iVar14 = iVar14 + 2;
    }
    if (x < 2) {
      iVar9 = x + 1;
      puVar2 = &r[iVar9][y].doortable;
      *puVar2 = *puVar2 & 0xfb;
      iVar6 = (int)r[iVar9][y].rlx;
      iVar5 = (int)r[iVar9][y].rly;
      if (r[iVar9][y].real == '\0') {
        uVar13 = iVar6 + iVar9 * 0x1a + 1;
        uVar10 = y * 7 + iVar5;
      }
      else {
        iVar7 = rn2((int)r[iVar9][y].dy);
        uVar13 = iVar9 * 0x1a + iVar6;
        uVar10 = y * 7 + iVar5 + iVar7;
        cVar3 = lev->locations[(int)uVar13][(int)uVar10].typ;
        if (cVar3 == '\0' || '\f' < cVar3) {
          impossible("left: no wall at %d,%d?",(ulong)uVar13,(ulong)uVar10);
        }
        dodoor(lev,uVar13,uVar10,lev->rooms + r[iVar9][y].nroom);
        puVar1 = &lev->locations[(int)uVar13][(int)uVar10].field_0x6;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe0f;
        uVar13 = uVar13 - 1;
      }
      iVar5 = 1;
      goto LAB_0019912c;
    }
    s = "right door from %d,%d going nowhere?";
    uVar11 = 2;
    uVar8 = (ulong)(uint)y;
  }
  else {
    if (dir != 2) {
      impossible("corridor in direction %d?",(ulong)(uint)dir);
      return;
    }
    puVar2 = &r[x][y].doortable;
    *puVar2 = *puVar2 & 0xfd;
    iVar14 = (int)r[x][y].rlx;
    if (r[x][y].real == '\0') {
      iVar14 = x * 0x1a + iVar14 + 1;
      uVar12 = y * 7 + (int)r[x][y].rly;
    }
    else {
      iVar5 = rn2((int)r[x][y].dx);
      iVar14 = iVar5 + iVar14 + x * 0x1a + 1;
      uVar12 = y * 7 + (int)r[x][y].rly + (int)r[x][y].dy;
      cVar3 = lev->locations[iVar14][(int)uVar12].typ;
      if (cVar3 == '\0' || '\f' < cVar3) {
        impossible("down: no wall at %d,%d?",iVar14,(ulong)uVar12);
      }
      dodoor(lev,iVar14,uVar12,lev->rooms + r[x][y].nroom);
      puVar1 = &lev->locations[iVar14][(int)uVar12].field_0x6;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe0f;
      uVar12 = uVar12 + 1;
    }
    if (y < 2) {
      iVar9 = y + 1;
      puVar2 = &r[x][iVar9].doortable;
      *puVar2 = *puVar2 & 0xfe;
      iVar5 = (int)r[x][iVar9].rlx;
      if (r[x][iVar9].real == '\0') {
        uVar13 = iVar5 + x * 0x1a + 1;
        uVar10 = iVar9 * 7 + (int)r[x][iVar9].rly;
      }
      else {
        iVar6 = rn2((int)r[x][iVar9].dx);
        uVar13 = iVar6 + iVar5 + x * 0x1a + 1;
        iVar5 = iVar9 * 7 + (int)r[x][iVar9].rly;
        uVar10 = iVar5 - 1;
        cVar3 = lev->locations[(int)uVar13][(int)uVar10].typ;
        if (cVar3 == '\0' || '\f' < cVar3) {
          impossible("up: no wall at %d,%d?",(ulong)uVar13,(ulong)uVar10);
        }
        dodoor(lev,uVar13,uVar10,lev->rooms + r[x][iVar9].nroom);
        puVar1 = &lev->locations[(int)uVar13][(int)uVar10].field_0x6;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe0f;
        uVar10 = iVar5 - 2;
      }
      iVar5 = 0;
LAB_0019912c:
      roguejoin(lev,iVar14,uVar12,uVar13,uVar10,iVar5);
      return;
    }
    s = "down door from %d,%d going nowhere?";
    uVar8 = 2;
    uVar11 = (ulong)(uint)x;
  }
  impossible(s,uVar11,uVar8);
  return;
}

Assistant:

static void roguecorr(struct level *lev, int x, int y, int dir)
{
	int fromx, fromy, tox, toy;

	if (dir==DOWN) {
		r[x][y].doortable &= ~DOWN;
		if (!r[x][y].real) {
			fromx = r[x][y].rlx; fromy = r[x][y].rly;
			fromx += 1 + 26*x; fromy += 7*y;
		} else {
			fromx = r[x][y].rlx + rn2(r[x][y].dx);
			fromy = r[x][y].rly + r[x][y].dy;
			fromx += 1 + 26*x; fromy += 7*y;
			if (!IS_WALL(lev->locations[fromx][fromy].typ))
				impossible("down: no wall at %d,%d?",fromx,
									fromy);
			dodoor(lev, fromx, fromy, &lev->rooms[r[x][y].nroom]);
			lev->locations[fromx][fromy].doormask = D_NODOOR;
			fromy++;
		}
		if (y >= 2) {
			impossible("down door from %d,%d going nowhere?",x,y);
			return;
		}
		y++;
		r[x][y].doortable &= ~UP;
		if (!r[x][y].real) {
			tox = r[x][y].rlx; toy = r[x][y].rly;
			tox += 1 + 26*x; toy += 7*y;
		} else {
			tox = r[x][y].rlx + rn2(r[x][y].dx);
			toy = r[x][y].rly - 1;
			tox += 1 + 26*x; toy += 7*y;
			if (!IS_WALL(lev->locations[tox][toy].typ))
				impossible("up: no wall at %d,%d?",tox,toy);
			dodoor(lev, tox, toy, &lev->rooms[r[x][y].nroom]);
			lev->locations[tox][toy].doormask = D_NODOOR;
			toy--;
		}
		roguejoin(lev, fromx, fromy, tox, toy, FALSE);
		return;
	} else if (dir == RIGHT) {
		r[x][y].doortable &= ~RIGHT;
		if (!r[x][y].real) {
			fromx = r[x][y].rlx; fromy = r[x][y].rly;
			fromx += 1 + 26*x; fromy += 7*y;
		} else {
			fromx = r[x][y].rlx + r[x][y].dx;
			fromy = r[x][y].rly + rn2(r[x][y].dy);
			fromx += 1 + 26*x; fromy += 7*y;
			if (!IS_WALL(lev->locations[fromx][fromy].typ))
				impossible("down: no wall at %d,%d?",fromx,
									fromy);
			dodoor(lev, fromx, fromy, &lev->rooms[r[x][y].nroom]);
			lev->locations[fromx][fromy].doormask = D_NODOOR;
			fromx++;
		}
		if (x >= 2) {
			impossible("right door from %d,%d going nowhere?",x,y);
			return;
		}
		x++;
		r[x][y].doortable &= ~LEFT;
		if (!r[x][y].real) {
			tox = r[x][y].rlx; toy = r[x][y].rly;
			tox += 1 + 26*x; toy += 7*y;
		} else {
			tox = r[x][y].rlx - 1;
			toy = r[x][y].rly + rn2(r[x][y].dy);
			tox += 1 + 26*x; toy += 7*y;
			if (!IS_WALL(lev->locations[tox][toy].typ))
				impossible("left: no wall at %d,%d?",tox,toy);
			dodoor(lev, tox, toy, &lev->rooms[r[x][y].nroom]);
			lev->locations[tox][toy].doormask = D_NODOOR;
			tox--;
		}
		roguejoin(lev, fromx, fromy, tox, toy, TRUE);
		return;
	} else impossible("corridor in direction %d?",dir);
}